

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

void __thiscall
FStateDefinitions::ResolveGotoLabels
          (FStateDefinitions *this,PClassActor *actor,AActor *defaults,
          TArray<FStateDefine,_FStateDefine> *list)

{
  char *name;
  FStateDefine *pFVar1;
  FState *pFVar2;
  ulong uVar3;
  AActor *actor_00;
  long lVar4;
  
  if (list->Count != 0) {
    lVar4 = 0x20;
    uVar3 = 0;
    actor_00 = (AActor *)actor;
    do {
      name = *(char **)((long)list->Array + lVar4 + -8);
      if ((name != (char *)0x0) && (*(char *)((long)&(list->Array->Label).Index + lVar4) == '\x04'))
      {
        pFVar2 = ResolveGotoLabel(this,actor_00,actor,name);
        pFVar1 = list->Array;
        *(FState **)((long)pFVar1 + lVar4 + -8) = pFVar2;
        *(undefined1 *)((long)&(pFVar1->Label).Index + lVar4) = 1;
      }
      if (*(int *)((long)list->Array + lVar4 + -0xc) != 0) {
        actor_00 = (AActor *)actor;
        ResolveGotoLabels(this,actor,defaults,
                          (TArray<FStateDefine,_FStateDefine> *)((long)list->Array + lVar4 + -0x18))
        ;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x28;
    } while (uVar3 < list->Count);
  }
  return;
}

Assistant:

void FStateDefinitions::ResolveGotoLabels (PClassActor *actor, AActor *defaults, TArray<FStateDefine> & list)
{
	for (unsigned i = 0; i < list.Size(); i++)
	{
		if (list[i].State != NULL && list[i].DefineFlags == SDF_LABEL)
		{ // It's not a valid state, so it must be a label string. Resolve it.
			list[i].State = ResolveGotoLabel (defaults, actor, (char *)list[i].State);
			list[i].DefineFlags = SDF_STATE;
		}
		if (list[i].Children.Size() > 0) ResolveGotoLabels(actor, defaults, list[i].Children);
	}
}